

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::operator+(String *this,int64 c)

{
  int64 in_RDX;
  uchar *extraout_RDX;
  String SVar1;
  int64 c_local;
  String *this_local;
  String *retval;
  
  String(this,(String *)c);
  operator+=(this,in_RDX);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String String::operator+(const int64 c) const
    {
        String retval(*this);
        retval += c;
        return retval;
    }